

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_server.c
# Opt level: O2

void * uo_tcp_server_accept(void *arg)

{
  uo_inthashtbl *hashtbl;
  int iVar1;
  uo_tcp_conn *tcp_conn;
  void *pvVar2;
  
  uo_cb_thrd_init();
  hashtbl = (uo_inthashtbl *)((long)arg + 0x68);
  while (iVar1 = accept(*(int *)((long)arg + 0xb0),(sockaddr *)0x0,(socklen_t *)0x0),
        *(char *)((long)arg + 0xb4) != '\x01') {
    if (iVar1 == -1) {
      uo_err("Error while accepting connection.");
    }
    else {
      tcp_conn = uo_tcp_conn_create_for_server(iVar1,(uo_tcp_server *)arg);
      uo_tcp_conn_open(tcp_conn);
      uo_inthashtbl_set(hashtbl,iVar1,tcp_conn);
      while( true ) {
        do {
          pvVar2 = uo_queue_dequeue(*(uo_queue **)((long)arg + 0x98),false);
          iVar1 = (int)pvVar2;
        } while (iVar1 == -1);
        if (iVar1 == 0) break;
        uo_inthashtbl_remove(hashtbl,iVar1);
      }
    }
  }
  while (*(long *)((long)arg + 0x78) != 0) {
    pvVar2 = uo_queue_dequeue(*(uo_queue **)((long)arg + 0x98),true);
    if ((int)pvVar2 != -1) {
      uo_inthashtbl_remove(hashtbl,(int)pvVar2);
    }
  }
  uo_cb_thrd_quit();
  return (void *)0x0;
}

Assistant:

static void *uo_tcp_server_accept(
    void *arg)
{
    uo_cb_thrd_init();

    uo_tcp_server *tcp_server = arg;

    int sockfd;

    while (true)
    {
        sockfd = accept(tcp_server->sockfd, NULL, NULL);

        if (tcp_server->is_closing)
            break;

        if (sockfd == -1)
        {
            uo_err("Error while accepting connection.");
            continue;
        }

        uo_tcp_conn *tcp_conn = uo_tcp_conn_create_for_server(sockfd, tcp_server);
        uo_tcp_conn_open(tcp_conn);

        uo_inthashtbl_set(&tcp_server->conns, sockfd, tcp_conn);

        while (sockfd = (uintptr_t)uo_queue_dequeue(tcp_server->closing_conns, false))
            if (sockfd != -1)
                uo_inthashtbl_remove(&tcp_server->conns, sockfd);
    }

    while (tcp_server->conns.count)
        if ((sockfd = (uintptr_t)uo_queue_dequeue(tcp_server->closing_conns, true)) != -1)
            uo_inthashtbl_remove(&tcp_server->conns, sockfd);

    uo_cb_thrd_quit();

    return NULL;
}